

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_clear_bindings(sqlite3_stmt *pStmt)

{
  sqlite3_mutex *psVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  psVar1 = *(sqlite3_mutex **)(*(long *)pStmt + 0x18);
  if (psVar1 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar1);
  }
  if (0 < *(short *)(pStmt + 0x88)) {
    lVar2 = *(long *)(pStmt + 0x78);
    lVar4 = 0;
    lVar3 = 0;
    do {
      sqlite3VdbeMemRelease((Mem *)(lVar2 + lVar4));
      lVar2 = *(long *)(pStmt + 0x78);
      *(undefined2 *)(lVar2 + 0x24 + lVar4) = 1;
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x38;
    } while (lVar3 < *(short *)(pStmt + 0x88));
  }
  if (((*(ushort *)(pStmt + 0x9a) >> 9 & 1) != 0) && (*(int *)(pStmt + 0xf4) != 0)) {
    *(ushort *)(pStmt + 0x9a) = *(ushort *)(pStmt + 0x9a) | 0x20;
  }
  if (psVar1 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar1);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_clear_bindings(sqlite3_stmt *pStmt){
  int i;
  int rc = SQLITE_OK;
  Vdbe *p = (Vdbe*)pStmt;
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex = ((Vdbe*)pStmt)->db->mutex;
#endif
  sqlite3_mutex_enter(mutex);
  for(i=0; i<p->nVar; i++){
    sqlite3VdbeMemRelease(&p->aVar[i]);
    p->aVar[i].flags = MEM_Null;
  }
  if( p->isPrepareV2 && p->expmask ){
    p->expired = 1;
  }
  sqlite3_mutex_leave(mutex);
  return rc;
}